

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

size_t units::findOperatorSep(string *ustring,string *operators)

{
  char cVar1;
  undefined8 in_RAX;
  size_t sVar2;
  size_t sVar3;
  int index;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__cxx11::string::append((char *)operators);
  sVar2 = std::__cxx11::string::find_last_of
                    ((char *)ustring,(ulong)(operators->_M_dataplus)._M_p,0xffffffffffffffff);
  sVar3 = 0xffffffffffffffff;
  if (sVar2 - 1 < 0xfffffffffffffffe) {
    while (((cVar1 = (ustring->_M_dataplus)._M_p[sVar2], cVar1 == ')' || (cVar1 == '}')) ||
           (sVar3 = sVar2, cVar1 == ']'))) {
      uStack_28 = CONCAT44((int)sVar2 + -1,(undefined4)uStack_28);
      cVar1 = getMatchCharacter(cVar1);
      segmentcheckReverse(ustring,cVar1,(int *)((long)&uStack_28 + 4));
      if ((long)uStack_28._4_4_ < 1) {
        return 0xffffffffffffffff;
      }
      sVar2 = std::__cxx11::string::find_last_of
                        ((char *)ustring,(ulong)(operators->_M_dataplus)._M_p,(long)uStack_28._4_4_)
      ;
      if (0xfffffffffffffffd < sVar2 - 1) {
        return 0xffffffffffffffff;
      }
    }
  }
  return sVar3;
}

Assistant:

static size_t findOperatorSep(const std::string& ustring, std::string operators)
{
    operators.append(")}]");
    auto sep = ustring.find_last_of(operators);

    while (
        sep != std::string::npos && sep > 0 &&
        (ustring[sep] == ')' || ustring[sep] == '}' || ustring[sep] == ']')) {
        int index = static_cast<int>(sep) - 1;
        segmentcheckReverse(ustring, getMatchCharacter(ustring[sep]), index);
        sep = (index > 0) ? ustring.find_last_of(operators, index) :
                            std::string::npos;
    }
    if (sep == 0) {
        // this should not happen
        // LCOV_EXCL_START
        sep = std::string::npos;
        // LCOV_EXCL_STOP
    }
    return sep;
}